

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O0

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
getPredefinedTransformations1M1Q<float>
          (vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           *__return_storage_ptr__,Matrix<float,_6,_1,_0,_6,_1> *l1,Matrix<float,_6,_1,_0,_6,_1> *l2
          )

{
  EigenBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *pEVar1;
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *this;
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *this_00;
  Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *this_01;
  DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *this_02;
  Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *this_03;
  CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *pCVar2;
  RealScalar RVar3;
  RealScalar RVar4;
  Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0> local_cd8;
  undefined1 local_cc8 [8];
  Matrix<float,_4,_4,_0,_4,_4> TU_B;
  Matrix<float,4,4,0,4,4> local_c78 [8];
  Matrix<float,_4,_4,_0,_4,_4> TU;
  Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> local_c30 [56];
  Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> local_bf8 [61];
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_6,_6,_0,_6,_6>_>_>
  local_bbb [3];
  Matrix<float,6,6,0,6,6> local_bb8 [8];
  Matrix<float,_6,_6,_0,_6,_6> TUL2;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  local_aeb [3];
  Matrix<float,4,4,0,4,4> local_ae8 [8];
  Matrix<float,_4,_4,_0,_4,_4> TU2;
  Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false> local_aa0 [48];
  non_const_type local_a70;
  Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false> local_a68 [52];
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_a34 [12];
  non_const_type local_a28;
  Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false> local_a20 [48];
  non_const_type local_9f0;
  DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> local_9e4 [8];
  Matrix<float,_3,_3,_0,_3,_3> U2;
  Matrix<float,_3,_1,_0,_3,_1> local_9b4;
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_9a8 [8];
  Matrix<float,_3,_1,_0,_3,_1> U2_3P;
  Matrix<float,_3,_1,_0,_3,_1> U2_3M;
  Type local_958;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_6,_6,_0,_6,_6>_>_>
  local_91b [3];
  Matrix<float,6,6,0,6,6> local_918 [8];
  Matrix<float,_6,_6,_0,_6,_6> TUL1;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  local_84b [3];
  Matrix<float,4,4,0,4,4> local_848 [8];
  Matrix<float,_4,_4,_0,_4,_4> TU1;
  RowXpr local_800;
  non_const_type local_7d0;
  RowXpr local_7c8;
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_794 [12];
  non_const_type local_788;
  RowXpr local_780;
  non_const_type local_750;
  undefined1 local_748 [8];
  Matrix<float,_3,_3,_0,_3,_3> U1;
  Matrix<float,_3,_1,_0,_3,_1> local_718;
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_70c [8];
  Matrix<float,_3,_1,_0,_3,_1> U1_3P;
  Matrix<float,_3,_1,_0,_3,_1> U1_3M;
  Matrix<float,_3,_1,_0,_3,_1> U2_1;
  Matrix<float,_3,_1,_0,_3,_1> U1_1;
  Scalar local_6d4;
  CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> local_6d0;
  Scalar local_6b0 [4];
  Scalar local_6a0;
  Scalar local_69c;
  CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> local_698;
  undefined1 local_678 [8];
  Matrix<float,_3,_1,_0,_3,_1> ey;
  Matrix<float,_3,_1,_0,_3,_1> ex;
  Matrix<float,3,1,0,3,1> local_624 [8];
  Matrix<float,_3,_1,_0,_3,_1> U2_3;
  Matrix<float,3,1,0,3,1> local_5dc [8];
  Matrix<float,_3,_1,_0,_3,_1> U1_3;
  Matrix<float,6,1,0,6,1> local_5c0 [8];
  Matrix<float,_6,_1,_0,_6,_1> lu2;
  Matrix<float,6,1,0,6,1> local_598 [8];
  Matrix<float,_6,_1,_0,_6,_1> lu1;
  Matrix<float,_3,_1,_0,_3,_1> local_548;
  DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> local_53c [36];
  DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>
  local_518 [16];
  Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> local_508 [56];
  Matrix<float,_3,_1,_0,_3,_1> local_4d0;
  DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> local_4c4 [36];
  DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>
  local_4a0 [21];
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_6,_6,_0,_6,_6>_>_>
  local_48b [3];
  Matrix<float,6,6,0,6,6> local_488 [8];
  Matrix<float,_6,_6,_0,_6,_6> TuL2;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_6,_6,_0,_6,_6>_>_>
  local_3eb [3];
  Matrix<float,6,6,0,6,6> local_3e8 [8];
  Matrix<float,_6,_6,_0,_6,_6> TuL1;
  Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> local_350 [56];
  Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> local_318 [61];
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  local_2db [3];
  Matrix<float,4,4,0,4,4> local_2d8 [8];
  Matrix<float,_4,_4,_0,_4,_4> Tu2;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  local_28b [3];
  Matrix<float,4,4,0,4,4> local_288 [8];
  Matrix<float,_4,_4,_0,_4,_4> Tu1;
  Product<Eigen::Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>
  local_240;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
  local_230;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  local_210;
  Matrix<float,3,1,0,3,1> local_1dc [8];
  Matrix<float,_3,_1,_0,_3,_1> u2;
  Product<Eigen::Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>
  local_1c8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
  local_1b8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  local_198;
  Matrix<float,3,1,0,3,1> local_164 [8];
  Matrix<float,_3,_1,_0,_3,_1> u1;
  Matrix<float,_3,_1,_0,_3,_1> x2;
  Matrix<float,_3,_1,_0,_3,_1> x1;
  Matrix<float,3,1,0,3,1> local_104 [8];
  Matrix<float,_3,_1,_0,_3,_1> m2;
  Matrix<float,3,1,0,3,1> local_bc [8];
  Matrix<float,_3,_1,_0,_3,_1> dir2;
  Matrix<float,3,1,0,3,1> local_74 [8];
  Matrix<float,_3,_1,_0,_3,_1> m1;
  Matrix<float,3,1,0,3,1> local_2c [8];
  Matrix<float,_3,_1,_0,_3,_1> dir1;
  Matrix<float,_6,_1,_0,_6,_1> *l2_local;
  Matrix<float,_6,_1,_0,_6,_1> *l1_local;
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  *trans;
  
  pEVar1 = (EigenBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
           (m1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
           1);
  dir1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array._4_8_ = l2
  ;
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            ((Type *)pEVar1,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)l1,3);
  Eigen::Matrix<float,3,1,0,3,1>::Matrix<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>>
            (local_2c,pEVar1);
  pEVar1 = (EigenBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
           (dir2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           + 1);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
            ((Type *)pEVar1,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)l1,3);
  Eigen::Matrix<float,3,1,0,3,1>::Matrix<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>>
            (local_74,pEVar1);
  pEVar1 = (EigenBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
           (m2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
           1);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            ((Type *)pEVar1,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)l2,3);
  Eigen::Matrix<float,3,1,0,3,1>::Matrix<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>>
            (local_bc,pEVar1);
  pEVar1 = (EigenBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
           (x1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
           1);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
            ((Type *)pEVar1,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)l2,3);
  Eigen::Matrix<float,3,1,0,3,1>::Matrix<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>>
            (local_104,pEVar1);
  this = (MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)
         (x2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array + 1)
  ;
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            (this,(MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_2c);
  this_00 = (MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)
            (u1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
            1);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            (this_00,(MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_bc);
  u2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array._4_8_ =
       Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::transpose
                 ((DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)this);
  local_1c8 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>::operator*
                        ((MatrixBase<Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>> *)
                         (u2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array + 1),
                         (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_2c);
  Eigen::operator*(&local_1b8,&local_1c8,(StorageBaseType *)local_2c);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator-
            (&local_198,this,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              *)&local_1b8);
  Eigen::Matrix<float,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,1,0,3,1>const>const,Eigen::Matrix<float,3,1,0,3,1>const>const>>
            (local_164,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>
              *)&local_198);
  Tu1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._56_8_ =
       Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::transpose
                 ((DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)this_00);
  local_240 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>::operator*
                        ((MatrixBase<Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>> *)
                         (Tu1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                          m_data.array + 0xe),
                         (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_bc);
  Eigen::operator*(&local_230,&local_240,(StorageBaseType *)local_bc);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator-
            (&local_210,this_00,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              *)&local_230);
  Eigen::Matrix<float,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,1,0,3,1>const>const,Eigen::Matrix<float,3,1,0,3,1>const>const>>
            (local_1dc,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>
              *)&local_210);
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity();
  Eigen::Matrix<float,4,4,0,4,4>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
            (local_288,local_28b);
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity();
  Eigen::Matrix<float,4,4,0,4,4>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
            (local_2d8,local_2db);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
            ((Type *)local_318,(DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_288,3,1);
  Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
            (local_318,(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_164);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
            ((Type *)local_350,(DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_2d8,3,1);
  Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
            (local_350,(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_1dc);
  Eigen::MatrixBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::Identity();
  Eigen::Matrix<float,6,6,0,6,6>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,6,6,0,6,6>>>
            (local_3e8,local_3eb);
  Eigen::MatrixBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::Identity();
  Eigen::Matrix<float,6,6,0,6,6>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,6,6,0,6,6>>>
            (local_488,local_48b);
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix(&local_4d0,(Matrix<float,_3,_1,_0,_3,_1> *)local_164);
  getSkew<float>((Matrix<float,_3,_3,_0,_3,_3> *)local_4c4,&local_4d0);
  Eigen::DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator-
            ((NegativeReturnType *)local_4a0,local_4c4);
  Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::block<int,int>
            ((Type *)local_508,(DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_3e8,3,0,3,3);
  Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=(local_508,local_4a0);
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix(&local_548,(Matrix<float,_3,_1,_0,_3,_1> *)local_1dc);
  getSkew<float>((Matrix<float,_3,_3,_0,_3,_3> *)local_53c,&local_548);
  Eigen::DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator-
            ((NegativeReturnType *)local_518,local_53c);
  this_01 = (Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)
            (lu1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
            + 4);
  Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::block<int,int>
            ((Type *)this_01,(DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_488,3,0,3,3);
  Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=(this_01,local_518);
  join_0x00000010_0x00000000_ =
       Eigen::MatrixBase<Eigen::Matrix<float,6,6,0,6,6>>::operator*
                 ((MatrixBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_3e8,
                  (MatrixBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)l1);
  Eigen::Matrix<float,6,1,0,6,1>::
  Matrix<Eigen::Product<Eigen::Matrix<float,6,6,0,6,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
            (local_598,
             (EigenBase<Eigen::Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
              *)(lu2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array + 4));
  join_0x00000010_0x00000000_ =
       Eigen::MatrixBase<Eigen::Matrix<float,6,6,0,6,6>>::operator*
                 ((MatrixBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_488,
                  (MatrixBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)l2);
  Eigen::Matrix<float,6,1,0,6,1>::
  Matrix<Eigen::Product<Eigen::Matrix<float,6,6,0,6,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
            (local_5c0,
             (EigenBase<Eigen::Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
              *)(U1_3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array + 1));
  pEVar1 = (EigenBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
           (U2_3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           + 1);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            ((Type *)pEVar1,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_598,3);
  Eigen::Matrix<float,3,1,0,3,1>::Matrix<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>>
            (local_5dc,pEVar1);
  pEVar1 = (EigenBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
           (ex.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
           1);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            ((Type *)pEVar1,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_5c0,3);
  Eigen::Matrix<float,3,1,0,3,1>::Matrix<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>>
            (local_624,pEVar1);
  this_02 = (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
            (ey.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
            1);
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix((Matrix<float,_3,_1,_0,_3,_1> *)this_02);
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix((Matrix<float,_3,_1,_0,_3,_1> *)local_678);
  local_69c = 1.0;
  Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator<<(&local_698,this_02,&local_69c);
  local_6a0 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                     (&local_698,&local_6a0);
  local_6b0[0] = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_(pCVar2,local_6b0);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_698);
  local_6d4 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator<<
            (&local_6d0,(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_678,&local_6d4);
  U1_1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] = 1.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                     (&local_6d0,
                      U1_1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                      m_data.array + 2);
  U1_1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
            (pCVar2,U1_1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                    m_data.array + 1);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_6d0);
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (U2_1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (U1_3M.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            ((MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)
             (U1_3P.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1),(MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_678);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            (local_70c,
             (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
             (ey.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  RVar3 = Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                     (U1_3P.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                      m_data.array + 1));
  RVar4 = Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_70c);
  if (RVar3 <= RVar4) {
    Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::normalized
              ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
               (U1.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 7));
    Eigen::Matrix<float,_3,_1,_0,_3,_1>::operator=
              ((Matrix<float,_3,_1,_0,_3,_1> *)
               (U2_1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 1),
               (Matrix<float,_3,_1,_0,_3,_1> *)
               (U1.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 7));
  }
  else {
    Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::normalized
              ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_718);
    Eigen::Matrix<float,_3,_1,_0,_3,_1>::operator=
              ((Matrix<float,_3,_1,_0,_3,_1> *)
               (U2_1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 1),&local_718);
  }
  Eigen::Matrix<float,_3,_3,_0,_3,_3>::Matrix((Matrix<float,_3,_3,_0,_3,_3> *)local_748);
  local_750 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                         (U2_1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                          .m_data.array + 1));
  Eigen::DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::row
            (&local_780,(DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)local_748,0);
  Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false>::operator=
            ((Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false> *)&local_780,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_> *)&local_750);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            (local_794,(MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_5dc);
  local_788 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_794);
  Eigen::DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::row
            (&local_7c8,(DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)local_748,1);
  Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false>::operator=
            ((Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false> *)&local_7c8,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_> *)&local_788);
  local_7d0 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_5dc);
  Eigen::DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::row
            (&local_800,(DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)local_748,2);
  Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false>::operator=
            ((Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false> *)&local_800,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_> *)&local_7d0);
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity();
  Eigen::Matrix<float,4,4,0,4,4>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
            (local_848,local_84b);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
            ((Type *)(TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.
                      m_data.array + 0x22),(DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_848,3,
             3);
  Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)
             (TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
              array + 0x22),(DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)local_748);
  Eigen::MatrixBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::Identity();
  Eigen::Matrix<float,6,6,0,6,6>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,6,6,0,6,6>>>
            (local_918,local_91b);
  Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::topLeftCorner<int,int>
            (&local_958,(DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_918,3,3);
  Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)&local_958,
             (DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)local_748);
  Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::block<int,int>
            ((Type *)(U2_3M.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                      m_data.array + 1),(DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_918,3,3,3
             ,3);
  Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)
             (U2_3M.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1),(DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)local_748);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            ((MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)
             (U2_3P.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 1),(MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_678);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            (local_9a8,
             (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
             (ey.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  RVar3 = Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                     (U2_3P.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                      m_data.array + 1));
  RVar4 = Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_9a8);
  if (RVar3 <= RVar4) {
    Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::normalized
              ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
               (U2.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 7));
    Eigen::Matrix<float,_3,_1,_0,_3,_1>::operator=
              ((Matrix<float,_3,_1,_0,_3,_1> *)
               (U1_3M.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 1),
               (Matrix<float,_3,_1,_0,_3,_1> *)
               (U2.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 7));
  }
  else {
    Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::normalized
              ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_9b4);
    Eigen::Matrix<float,_3,_1,_0,_3,_1>::operator=
              ((Matrix<float,_3,_1,_0,_3,_1> *)
               (U1_3M.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 1),&local_9b4);
  }
  Eigen::Matrix<float,_3,_3,_0,_3,_3>::Matrix((Matrix<float,_3,_3,_0,_3,_3> *)local_9e4);
  local_9f0 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                         (U1_3M.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array + 1));
  Eigen::DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::row((RowXpr *)local_a20,local_9e4,0);
  Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false>::operator=
            (local_a20,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_> *)&local_9f0);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            (local_a34,(MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_624);
  local_a28 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_a34);
  Eigen::DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::row((RowXpr *)local_a68,local_9e4,1);
  Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false>::operator=
            (local_a68,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_> *)&local_a28);
  local_a70 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_624);
  Eigen::DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::row((RowXpr *)local_aa0,local_9e4,2);
  Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false>::operator=
            (local_aa0,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_> *)&local_a70);
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity();
  Eigen::Matrix<float,4,4,0,4,4>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
            (local_ae8,local_aeb);
  this_03 = (Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)
            (TUL2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
            + 0x22);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
            ((Type *)this_03,(DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_ae8,3,3);
  Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=(this_03,local_9e4);
  Eigen::MatrixBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::Identity();
  Eigen::Matrix<float,6,6,0,6,6>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,6,6,0,6,6>>>
            (local_bb8,local_bbb);
  Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::topLeftCorner<int,int>
            ((Type *)local_bf8,(DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_bb8,3,3);
  Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=(local_bf8,local_9e4);
  Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::block<int,int>
            ((Type *)local_c30,(DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_bb8,3,3,3,3);
  Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=(local_c30,local_9e4);
  join_0x00000010_0x00000000_ =
       Eigen::MatrixBase<Eigen::Matrix<float,4,4,0,4,4>>::operator*
                 ((MatrixBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_848,
                  (MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_288);
  Eigen::Matrix<float,4,4,0,4,4>::
  Matrix<Eigen::Product<Eigen::Matrix<float,4,4,0,4,4>,Eigen::Matrix<float,4,4,0,4,4>,0>>
            (local_c78,
             (EigenBase<Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
              *)(TU_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                 array + 0xe));
  local_cd8 = Eigen::MatrixBase<Eigen::Matrix<float,4,4,0,4,4>>::operator*
                        ((MatrixBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_ae8,
                         (MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_2d8);
  Eigen::Matrix<float,4,4,0,4,4>::
  Matrix<Eigen::Product<Eigen::Matrix<float,4,4,0,4,4>,Eigen::Matrix<float,4,4,0,4,4>,0>>
            ((Matrix<float,4,4,0,4,4> *)local_cc8,
             (EigenBase<Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
              *)&local_cd8);
  std::
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  ::vector(__return_storage_ptr__);
  std::
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_c78);
  std::
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_cc8);
  return __return_storage_ptr__;
}

Assistant:

vector<Matrix<floatPrec, 4,4>> getPredefinedTransformations1M1Q(Matrix<floatPrec, 6,1> l1, Matrix<floatPrec, 6,1> l2){

	// get closest point --in the line-- to the origin
	Eigen::Matrix<floatPrec,3,1> dir1 = l1.head(3), m1 = l1.tail(3);
	Eigen::Matrix<floatPrec,3,1> dir2 = l2.head(3), m2 = l2.tail(3);
	Eigen::Matrix<floatPrec,3,1> x1 = dir1.cross(m1);
	Eigen::Matrix<floatPrec,3,1> x2 = dir2.cross(m2);
	
	// get transform to translate frames to the line
	Eigen::Matrix<floatPrec,3,1> u1 = x1 - x1.transpose()*dir1*dir1;
	Eigen::Matrix<floatPrec,3,1> u2 = x2 - x2.transpose()*dir2*dir2;
	Eigen::Matrix<floatPrec,4,4> Tu1 = Eigen::Matrix<floatPrec,4,4>::Identity(), Tu2 = Eigen::Matrix<floatPrec,4,4>::Identity();
	Tu1.topRightCorner(3,1) = u1;
	Tu2.topRightCorner(3,1) = u2;
	Eigen::Matrix<floatPrec,6,6> TuL1 = Eigen::Matrix<floatPrec,6,6>::Identity(), TuL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TuL1.block(3,0,3,3) = -getSkew<floatPrec>(u1);
	TuL2.block(3,0,3,3) = -getSkew<floatPrec>(u2);

	// transform point and line to new ref
	Eigen::Matrix<floatPrec,6,1> lu1 = TuL1*l1;
	Eigen::Matrix<floatPrec,6,1> lu2 = TuL2*l2;

	//align z axis with line direction
	Eigen::Matrix<floatPrec,3,1> U1_3 = lu1.head(3), U2_3 = lu2.head(3);
	Eigen::Matrix<floatPrec,3,1> ex, ey;
	ex << 1,0,0; ey << 0,1,0;
	Eigen::Matrix<floatPrec,3,1> U1_1, U2_1;
	// frame A
	Eigen::Matrix<floatPrec,3,1> U1_3M = ey.cross(U1_3);
	Eigen::Matrix<floatPrec,3,1> U1_3P = ex.cross(U1_3);
	if(U1_3M.norm() > U1_3P.norm())
		U1_1 = U1_3M.normalized();
	else
		U1_1 = U1_3P.normalized();
	Eigen::Matrix<floatPrec,3,3> U1;
	U1.row(0) = U1_1.transpose();
	U1.row(1) = U1_3.cross(U1_1).transpose();
	U1.row(2) = U1_3.transpose();
	Eigen::Matrix<floatPrec,4,4> TU1 = Eigen::Matrix<floatPrec,4,4>::Identity();
	TU1.topLeftCorner(3,3) = U1;
	Eigen::Matrix<floatPrec,6,6> TUL1 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TUL1.topLeftCorner(3,3) = U1; TUL1.block(3,3,3,3) = U1;
	// frame B
	Eigen::Matrix<floatPrec,3,1> U2_3M = ey.cross(U2_3);
	Eigen::Matrix<floatPrec,3,1> U2_3P = ex.cross(U2_3);
	if(U2_3M.norm() > U2_3P.norm())
		U2_1 = U2_3M.normalized();
	else
		U2_1 = U2_3P.normalized();
	Eigen::Matrix<floatPrec,3,3> U2;
	U2.row(0) = U2_1.transpose();
	U2.row(1) = U2_3.cross(U2_1).transpose();
	U2.row(2) = U2_3.transpose();
	Eigen::Matrix<floatPrec,4,4> TU2 = Eigen::Matrix<floatPrec,4,4>::Identity();
	TU2.topLeftCorner(3,3) = U2;
	Eigen::Matrix<floatPrec,6,6> TUL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TUL2.topLeftCorner(3,3) = U2; TUL2.block(3,3,3,3) = U2;

	Eigen::Matrix<floatPrec,4,4> TU = TU1*Tu1;
	Eigen::Matrix<floatPrec,4,4> TU_B = TU2*Tu2;

	std::vector<Eigen::Matrix<floatPrec,4,4>> trans;
	trans.push_back(TU);
	trans.push_back(TU_B);

	return trans;

}